

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * ToByteVector<CPubKey>(CPubKey *in)

{
  long lVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  CPubKey *in_RDI;
  long in_FS_OFFSET;
  allocator<unsigned_char> *in_stack_ffffffffffffff98;
  allocator_type *in_stack_ffffffffffffffd0;
  uchar *in_stack_ffffffffffffffd8;
  CPubKey *__first;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __first = in_RDI;
  CPubKey::begin((CPubKey *)in_stack_ffffffffffffff98);
  CPubKey::end(in_RDI);
  std::allocator<unsigned_char>::allocator(in_stack_ffffffffffffff98);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            (in_RSI,__first->vch,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::allocator<unsigned_char>::~allocator(in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<unsigned char> ToByteVector(const T& in)
{
    return std::vector<unsigned char>(in.begin(), in.end());
}